

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

void __thiscall cppcms::http::cookie::cookie(cookie *this)

{
  copy_ptr<cppcms::http::cookie::_data> *in_RDI;
  
  booster::copy_ptr<cppcms::http::cookie::_data>::copy_ptr(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffe;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffd;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffffb;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xfffffff7;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffef;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffdf;
  *(uint *)&in_RDI[0x17].ptr_ = *(uint *)&in_RDI[0x17].ptr_ & 0xffffffbf;
  return;
}

Assistant:

cookie::cookie() : secure_(0), has_age_(0), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0) {}